

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall SignerInfo::SetDataSize(SignerInfo *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar1 = DerBase::EncodedSize(&(this->version).super_DerBase);
  sVar2 = DerBase::EncodedSize((DerBase *)&this->sid);
  sVar3 = DerBase::EncodedSize(&(this->digestAlgorithm).super_DerBase);
  sVar4 = GetEncodedSize<Attribute>(&this->signedAttrs);
  sVar5 = DerBase::EncodedSize(&(this->signatureAlgorithm).super_DerBase);
  sVar6 = DerBase::EncodedSize(&(this->signature).super_DerBase);
  sVar7 = GetEncodedSize<Attribute>(&this->unsignedAttrs);
  sVar1 = sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
  (this->super_DerBase).cbData = sVar1;
  return sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return	(
				cbData =
				version.EncodedSize() +
				sid.EncodedSize() +
				digestAlgorithm.EncodedSize() +
				GetEncodedSize(signedAttrs) +
				signatureAlgorithm.EncodedSize() +
				signature.EncodedSize() +
				GetEncodedSize(unsignedAttrs)
				);
	}